

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * identifiderExp(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  ptVar2 = (treeNode *)operator_new(0x58);
  (ptVar2->lineNo).row = 0;
  (ptVar2->lineNo).col = 0;
  ptVar2->nodeKind = statement;
  ptVar2->kind = (Kind)0x0;
  ptVar2->child[0] = (treeNode *)0x0;
  ptVar2->child[1] = (treeNode *)0x0;
  ptVar2->child[2] = (treeNode *)0x0;
  ptVar2->sibling = (treeNode *)0x0;
  (ptVar2->text)._M_dataplus._M_p = (pointer)&(ptVar2->text).field_2;
  (ptVar2->text)._M_string_length = 0;
  (ptVar2->text).field_2._M_local_buf[0] = '\0';
  ptVar2->attrKind = Text;
  ptVar2->nodeKind = expression;
  ptVar2->kind = (Kind)0x3;
  std::__cxx11::string::string((string *)&local_b8,"++",&local_d9);
  bVar1 = match(&local_b8,Empty);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_b8);
LAB_0010829a:
    ptVar3 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_58,(string *)&preToken.text);
    treeNode::treeNode(ptVar3,opExp,&local_58);
    ptVar2->child[0] = ptVar3;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"--",&local_da);
    bVar1 = match(&local_38,Empty);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_b8);
    if (bVar1) goto LAB_0010829a;
  }
  ptVar3 = identifider();
  ptVar2->child[1] = ptVar3;
  std::__cxx11::string::string((string *)&local_d8,"++",&local_d9);
  bVar1 = match(&local_d8,Empty);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,"--",&local_da);
    bVar1 = match(&local_78,Empty);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar1) goto LAB_0010838f;
  }
  ptVar3 = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_98,(string *)&preToken.text);
  treeNode::treeNode(ptVar3,opExp,&local_98);
  ptVar2->child[2] = ptVar3;
  std::__cxx11::string::~string((string *)&local_98);
LAB_0010838f:
  ptVar3 = ptVar2;
  if ((ptVar2->child[0] == (treeNode *)0x0) && (ptVar2->child[2] == (treeNode *)0x0)) {
    ptVar3 = ptVar2->child[1];
    std::__cxx11::string::~string((string *)&ptVar2->text);
    operator_delete(ptVar2);
  }
  return ptVar3;
}

Assistant:

treeNode* identifiderExp()
{
    treeNode* ret=new treeNode(NodeKind::expression);
    if(match("++")||match("--"))
    {
        ret->child[0]=new treeNode(ExpKind::opExp,preToken.text);
    }
    ret->child[1]=identifider();
    if(match("++")||match("--"))
    {
        ret->child[2]=new treeNode(ExpKind::opExp,preToken.text);
    }

    if(ret->child[0]==nullptr&&ret->child[2]==nullptr)
    {
        auto tmp = ret->child[1];
        delete ret;
        return tmp;
    }
    else
        return ret;
}